

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O1

void XUtf8DrawRtlString(Display *display,Drawable d,XUtf8FontStruct *font_set,GC gc,int x,int y,
                       char *string,int num_bytes)

{
  XFontStruct **ppXVar1;
  uint ucs_00;
  XFontStruct **ppXVar2;
  Display *pDVar3;
  int *piVar4;
  unsigned_short uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  undefined2 *puVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  undefined4 uVar14;
  ulong uVar15;
  bool bVar16;
  uint ucs;
  XChar2b buf [128];
  undefined2 local_1c6;
  int local_1c4;
  int local_1c0;
  uint local_1bc;
  ulong local_1b8;
  GC local_1b0;
  int local_1a4;
  XFontStruct **local_1a0;
  ulong local_198;
  Display *local_190;
  undefined2 *local_188;
  Drawable local_180;
  ulong local_178;
  int local_170;
  uint local_16c;
  int *local_168;
  uchar *local_160;
  int *local_158;
  int *local_150;
  ulong local_148;
  long local_140;
  undefined2 local_3a;
  undefined2 local_38 [4];
  
  uVar15 = (ulong)font_set->nb_font;
  if (0 < (long)uVar15) {
    local_168 = font_set->encodings;
    ppXVar1 = font_set->fonts;
    if (*ppXVar1 == (XFontStruct *)0x0) {
      uVar8 = 0;
      do {
        if (uVar15 - 1 == uVar8) {
          return;
        }
        uVar12 = uVar8 + 1;
        lVar9 = uVar8 + 1;
        uVar8 = uVar12;
      } while (ppXVar1[lVar9] == (XFontStruct *)0x0);
      bVar16 = uVar12 < uVar15;
    }
    else {
      bVar16 = true;
      uVar12 = 0;
    }
    if (bVar16) {
      puVar10 = local_38;
      local_1a4 = num_bytes;
      uVar8 = uVar12;
      local_1c4 = x;
      local_1c0 = y;
      local_1b0 = gc;
      local_1a0 = ppXVar1;
      local_190 = display;
      local_180 = d;
      if (num_bytes < 1) {
        uVar11 = 0;
      }
      else {
        local_160 = (uchar *)string;
        local_148 = uVar12 & 0xffffffff;
        local_150 = local_168 + uVar12;
        local_158 = font_set->ranges + uVar12 * 2 + 1;
        lVar9 = uVar12 - uVar15;
        uVar11 = 0;
        local_1b8 = uVar15;
        local_198 = uVar12;
        do {
          pDVar3 = local_190;
          ppXVar2 = local_1a0;
          local_170 = (int)uVar8;
          lVar13 = (long)local_170;
          local_188 = puVar10;
          local_140 = lVar13;
          if (0x78 < (int)uVar11) {
            XSetFont(local_190,local_1b0,local_1a0[lVar13]->fid);
            puVar10 = local_188;
            iVar6 = XTextWidth16(ppXVar2[lVar13],local_188,uVar11);
            uVar15 = local_1b8;
            local_1c4 = local_1c4 - iVar6;
            XDrawString16(pDVar3,local_180,local_1b0,local_1c4,local_1c0,puVar10,(int)uVar11);
            local_178 = 0;
            local_188 = local_38;
            uVar11 = local_178;
          }
          local_178 = uVar11;
          local_16c = XFastConvertUtf8ToUcs(local_160,local_1a4,&local_1bc);
          if ((int)local_16c < 2) {
            local_16c = 1;
          }
          uVar5 = XUtf8IsNonSpacing(local_1bc);
          piVar4 = local_150;
          if (uVar5 != 0) {
            local_1bc = (uint)uVar5;
          }
          ucs_00 = local_1bc;
          uVar8 = local_198 & 0xffffffff;
          if ((int)local_198 < (int)uVar15) {
            lVar13 = 0;
            do {
              if (ppXVar1[uVar12 + lVar13] != (XFontStruct *)0x0) {
                iVar6 = piVar4[lVar13];
                iVar7 = ucs2fontmap((char *)&local_1c6,ucs_00,iVar6);
                if ((-1 < iVar7) &&
                   ((iVar6 != 0 ||
                    ((local_158[lVar13 * 2 + -1] <= (int)ucs_00 &&
                     ((int)ucs_00 <= local_158[lVar13 * 2])))))) {
                  uVar8 = (ulong)(uint)((int)lVar13 + (int)local_198);
                  uVar15 = local_1b8;
                  goto LAB_001fba18;
                }
              }
              lVar13 = lVar13 + 1;
            } while (lVar9 + lVar13 != 0);
            uVar8 = local_1b8 & 0xffffffff;
            uVar15 = local_1b8;
          }
LAB_001fba18:
          if ((int)uVar8 == (int)uVar15) {
            ucs2fontmap((char *)&local_1c6,0x3f,local_168[local_148]);
            uVar8 = local_198;
          }
          lVar13 = local_140;
          ppXVar2 = local_1a0;
          if ((uVar5 == 0) && (local_170 == (int)uVar8)) {
            *(char *)(local_188 + -1) = (char)local_1c6;
            *(undefined1 *)((long)local_188 + -1) = local_1c6._1_1_;
            puVar10 = local_188 + -1;
            uVar11 = (ulong)((int)local_178 + 1);
          }
          else {
            XSetFont(local_190,local_1b0,local_1a0[local_140]->fid);
            puVar10 = local_188;
            uVar14 = (undefined4)local_178;
            iVar6 = XTextWidth16(ppXVar2[lVar13],local_188,local_178 & 0xffffffff);
            iVar6 = local_1c4 - iVar6;
            XDrawString16(local_190,local_180,local_1b0,iVar6,local_1c0,puVar10,uVar14);
            local_3a = local_1c6;
            if (uVar5 != 0) {
              iVar7 = XTextWidth16(local_1a0[(int)uVar8],&local_3a,1);
              iVar6 = iVar6 + iVar7;
            }
            local_1c4 = iVar6;
            puVar10 = &local_3a;
            uVar11 = 1;
            uVar15 = local_1b8;
          }
          local_160 = local_160 + local_16c;
          iVar6 = local_1a4 - local_16c;
          bVar16 = (int)local_16c <= local_1a4;
          local_1a4 = iVar6;
        } while (iVar6 != 0 && bVar16);
      }
      pDVar3 = local_190;
      ppXVar1 = local_1a0;
      iVar6 = local_1c4;
      if (0 < (int)uVar11) {
        XSetFont(local_190,local_1b0,local_1a0[(int)uVar8]->fid);
        iVar7 = XTextWidth16(ppXVar1[(int)uVar8],puVar10,uVar11);
        XDrawString16(pDVar3,local_180,local_1b0,iVar6 - iVar7,local_1c0,puVar10,(int)uVar11);
      }
    }
  }
  return;
}

Assistant:

void
XUtf8DrawRtlString(Display 		*display,
		   Drawable 		d,
		   XUtf8FontStruct 	*font_set,
		   GC 			gc,
		   int 			x,
		   int 			y,
		   const char		*string,
		   int 			num_bytes) {

  int 		*encodings;	/* encodings array */
  XFontStruct 	**fonts;	/* fonts array */
  Fl_XChar2b 	buf[128];	/* drawing buffer */
  Fl_XChar2b	*ptr;		/* pointer to the drawing buffer */
  int 		fnum;		/* index of the current font in the fonts array*/
  int 		i;		/* current byte in the XChar2b buffer */
  int 		first;		/* first valid font index */
  int 		last_fnum;	/* font index of the previous char */
  int 		nb_font;	/* quantity of fonts in the font array */
  char 		glyph[2];	/* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;	/* sub range of iso10646 */

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;
  ptr = buf + 128;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** draw the buffer **/
      XSetFont(display, gc, fonts[fnum]->fid);
      x -= XTextWidth16(fonts[fnum], ptr, i);
      XDrawString16(display, d, gc, x, y, ptr, i);
      i = 0;
      ptr = buf + 128;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) ucs = no_spc;

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] && (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      XSetFont(display, gc, fonts[last_fnum]->fid);
      x -= XTextWidth16(fonts[last_fnum], ptr, i);
      XDrawString16(display, d, gc, x, y, ptr, i);
      i = 0;
      ptr = buf + 127;
      (*ptr).byte1 = glyph[0];
      (*ptr).byte2 = glyph[1];
      if (no_spc) {
	x += XTextWidth16(fonts[fnum], ptr, 1);
      }
    } else {
      ptr--;
      (*ptr).byte1 = glyph[0];
      (*ptr).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  if (i < 1) return;

  XSetFont(display, gc, fonts[fnum]->fid);
  x -= XTextWidth16(fonts[last_fnum], ptr, i);
  XDrawString16(display, d, gc, x, y, ptr, i);
}